

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> * __thiscall
Matrix<double,_-1,_-1>::operator=(Matrix<double,__1,__1> *this,Matrix<double,__1,__1> matrix)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  double tmp;
  int j;
  int i;
  Matrix<double,__1,__1> *this_local;
  Matrix<double,__1,__1> matrix_local;
  
  matrix_local._0_8_ = matrix.data;
  this_local = matrix._0_8_;
  if (this != (Matrix<double,__1,__1> *)&this_local) {
    if ((this->data != (double *)0x0) && (this->data != (double *)0x0)) {
      operator_delete__(this->data);
    }
    iVar3 = col((Matrix<double,__1,__1> *)&this_local);
    this->cols = iVar3;
    iVar3 = row((Matrix<double,__1,__1> *)&this_local);
    this->rows = iVar3;
    iVar3 = col((Matrix<double,__1,__1> *)&this_local);
    iVar4 = row((Matrix<double,__1,__1> *)&this_local);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(iVar3 * iVar4);
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar6 = (double *)operator_new__(uVar5);
    this->data = pdVar6;
    for (tmp._4_4_ = 0; iVar3 = row((Matrix<double,__1,__1> *)&this_local), tmp._4_4_ < iVar3;
        tmp._4_4_ = tmp._4_4_ + 1) {
      for (tmp._0_4_ = 0; iVar3 = col((Matrix<double,__1,__1> *)&this_local), tmp._0_4_ < iVar3;
          tmp._0_4_ = tmp._0_4_ + 1) {
        pdVar6 = operator()((Matrix<double,__1,__1> *)&this_local,tmp._4_4_,tmp._0_4_);
        dVar1 = *pdVar6;
        pdVar6 = operator()(this,tmp._4_4_,tmp._0_4_);
        *pdVar6 = dVar1;
      }
    }
  }
  return this;
}

Assistant:

const Matrix<Type, _0, _1> & Matrix<Type, _0, _1>::operator= (const Matrix<Type, _0, _1> matrix)
{
    if(this == &matrix)
    {
        return *this;
    }
    if(this->data != NULL)
    {
        delete [] data;
    }

    this->cols = matrix.col();
    this->rows = matrix.row();
    this->data = new Type[matrix.col() * matrix.row()];
    for(int i = 0; i < matrix.row(); ++i)
       for(int j = 0; j < matrix.col(); ++j)
       {
            double tmp = matrix(i, j);
            this->operator()(i, j) = tmp;
       }
    
    return (*this);
}